

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Endpoints.cpp
# Opt level: O0

void __thiscall
helics::Endpoint::setCallback
          (Endpoint *this,
          function<void_(const_helics::Endpoint_&,_TimeRepresentation<count_time<9,_long>_>)>
          *callback)

{
  function<void_(const_helics::Endpoint_&,_TimeRepresentation<count_time<9,_long>_>)> *in_RDI;
  Endpoint *ept;
  MessageFederate *this_00;
  function<void_(helics::Endpoint_&,_TimeRepresentation<count_time<9,_long>_>)>
  *in_stack_ffffffffffffffc0;
  
  if (in_RDI[1]._M_invoker != (_Invoker_type)0x0) {
    ept = (Endpoint *)in_RDI[1]._M_invoker;
    this_00 = (MessageFederate *)&stack0xffffffffffffffd0;
    std::function<void(helics::Endpoint&,TimeRepresentation<count_time<9,long>>)>::
    function<std::function<void(helics::Endpoint_const&,TimeRepresentation<count_time<9,long>>)>const&,void>
              (in_stack_ffffffffffffffc0,in_RDI);
    helics::MessageFederate::setMessageNotificationCallback
              (this_00,ept,
               (function<void_(helics::Endpoint_&,_TimeRepresentation<count_time<9,_long>_>)> *)
               0x3232e3);
    std::function<void_(helics::Endpoint_&,_TimeRepresentation<count_time<9,_long>_>)>::~function
              ((function<void_(helics::Endpoint_&,_TimeRepresentation<count_time<9,_long>_>)> *)
               0x3232ef);
  }
  return;
}

Assistant:

void Endpoint::setCallback(const std::function<void(const Endpoint&, Time)>& callback)
{
    if (fed != nullptr) {
        fed->setMessageNotificationCallback(*this, callback);
    }
}